

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_test(char *infits,char *outfits,char *outfits2)

{
  double dVar1;
  bool bVar2;
  fitsfile *pfVar3;
  fitsfile *pfVar4;
  fitsfile *pfVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  long lVar16;
  fitsfile **ppfVar17;
  long *plVar18;
  undefined8 *puVar19;
  long *plVar20;
  double *pdVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  byte bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  int iStack0000000000000008;
  float fStack000000000000000c;
  int iStack0000000000000010;
  int iStack0000000000000014;
  uint uStack0000000000000018;
  float fStack000000000000001c;
  float fStack0000000000000020;
  int iStack0000000000000024;
  int iStack0000000000000028;
  float fStack000000000000002c;
  float in_stack_00000030;
  undefined8 in_stack_00000080;
  int in_stack_00000088;
  char in_stack_0000049c;
  double local_908;
  int local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  fitsfile *outfptr;
  int naxis;
  fitsfile *inputfptr;
  int bitpix;
  int local_238;
  int stat;
  uint local_230;
  int hdunum;
  int tstatus;
  int hdutype;
  fitsfile *tempfile;
  char dtype [8];
  fitsfile *outfptr2;
  float row_cpu;
  float row_elapse;
  fitsfile *local_1f8;
  undefined8 uStack_1f0;
  double bscale;
  char *local_1e0;
  float whole_elapse;
  float whole_cpu;
  int ncols;
  long *local_1c8;
  imgstats imagestats;
  LONGLONG nrows;
  long dataend;
  long datastart;
  long naxes [9];
  undefined4 local_c8;
  long headstart;
  char dimen [100];
  
  bVar25 = 0;
  plVar18 = &DAT_001bdcb0;
  plVar20 = naxes;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    *plVar20 = *plVar18;
    plVar18 = plVar18 + 1;
    plVar20 = plVar20 + 1;
  }
  stat = 0;
  naxis = 0;
  bitpix = 0;
  tstatus = 0;
  local_1e0 = infits;
  ffopentest(10,&inputfptr,infits,0,&stat);
  ffinit(&outfptr,outfits,&stat);
  ffinit(&outfptr2,outfits2,&stat);
  if (stat != 0) {
    ffrprt(_stderr,stat);
    exit(stat);
  }
  local_1c8 = (long *)&stack0x00000038;
  uVar23 = 0;
  iVar24 = 0;
  iVar14 = 0;
  do {
    uVar22 = (uint)uVar23;
    if (iVar14 != 0) {
      if (iVar14 == 0x6b) {
        stat = 0;
      }
      ffclos(outfptr2,&stat);
      ffclos(outfptr,&stat);
      ffclos(inputfptr,&stat);
      if (stat != 0) {
        ffrprt(_stderr,stat);
      }
      return 0;
    }
    ffghdt(inputfptr,&hdutype,&stat);
    if (hdutype == 0) {
      ffgipr(inputfptr,9,&bitpix,&naxis,naxes,&stat);
      iVar24 = 1;
      for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
        iVar24 = iVar24 * (int)naxes[lVar16];
      }
    }
    iVar14 = fits_is_compressed_image(inputfptr,&stat);
    if ((((iVar14 == 0) && (hdutype == 0)) && (naxis != 0)) &&
       ((iVar24 != 0 && (in_stack_00000080._4_4_ != 0)))) {
      if (bitpix - 1U < 0x3f && fStack0000000000000020 != 0.0) {
        tstatus = 0;
        ffgky(inputfptr,0x52,"BSCALE",&bscale,(char *)0x0,&tstatus);
        bVar2 = true;
        if ((tstatus == 0) && ((bscale != 1.0 || (NAN(bscale))))) {
          if (bitpix == 0x20) {
            fp_i4stat(inputfptr,naxis,naxes,&imagestats,&stat);
          }
          else {
            fp_i2stat(inputfptr,naxis,naxes,&imagestats,&stat);
          }
          uVar26 = SUB84(imagestats.noise2,0);
          uVar27 = (int)((ulong)imagestats.noise2 >> 0x20);
          if (imagestats.noise2 == 0.0 || imagestats.noise3 <= imagestats.noise2) {
            uVar26 = SUB84(imagestats.noise3,0);
            uVar27 = (int)((ulong)imagestats.noise3 >> 0x20);
          }
          uVar28 = SUB84(imagestats.noise5,0);
          uVar29 = (int)((ulong)imagestats.noise5 >> 0x20);
          if ((double)CONCAT44(uVar27,uVar26) <= imagestats.noise5 || imagestats.noise5 == 0.0) {
            uVar28 = uVar26;
            uVar29 = uVar27;
          }
          local_1f8 = (fitsfile *)((double)CONCAT44(uVar29,uVar28) / (double)fStack0000000000000020)
          ;
          ppfVar17 = &inputfptr;
          if (1.0 < (double)local_1f8) {
            uStack_1f0 = 0;
            fp_tmpnam("Tmpfile3","",tempfilename3);
            ffinit(&tempfile,tempfilename3,&stat);
            ffghdn(inputfptr,&hdunum);
            if (hdunum != 1) {
              ffcrim(tempfile,8,0,naxes,&stat);
            }
            ffcphd(inputfptr,tempfile,&stat);
            if (bitpix == 0x20) {
              fp_i4rescale(inputfptr,naxis,naxes,(double)local_1f8,tempfile,&stat);
            }
            else {
              fp_i2rescale(inputfptr,naxis,naxes,(double)local_1f8,tempfile,&stat);
            }
            bscale = (double)local_1f8 * bscale;
            bVar2 = false;
            ffuky(tempfile,0x52,"BSCALE",&bscale,(char *)0x0,&stat);
            ffrdef(tempfile,&stat);
            ppfVar17 = &tempfile;
          }
        }
        else {
          ppfVar17 = &inputfptr;
        }
      }
      else {
        bVar2 = true;
        ppfVar17 = &inputfptr;
      }
      local_1f8 = *ppfVar17;
      if (bitpix == -0x40) {
        builtin_strncpy(dtype,"-64",4);
        fp_r4stat(local_1f8,naxis,naxes,&imagestats,&stat);
LAB_0010899c:
        local_238 = 0x40;
      }
      else if (bitpix == -0x20) {
        builtin_strncpy(dtype,"-32",4);
        fp_r4stat(local_1f8,naxis,naxes,&imagestats,&stat);
LAB_0010896e:
        local_238 = 0x20;
      }
      else {
        if (bitpix == 0x40) {
          builtin_strncpy(dtype,"64 ",4);
          goto LAB_0010899c;
        }
        if (bitpix == 0x10) {
          builtin_strncpy(dtype,"16 ",4);
          fp_i2stat(local_1f8,naxis,naxes,&imagestats,&stat);
          local_238 = 0x10;
        }
        else {
          if (bitpix == 0x20) {
            builtin_strncpy(dtype,"32 ",4);
            fp_i4stat(local_1f8,naxis,naxes,&imagestats,&stat);
            goto LAB_0010896e;
          }
          if (bitpix == 8) {
            builtin_strncpy(dtype,"8  ",4);
            fp_i2stat(local_1f8,naxis,naxes,&imagestats,&stat);
            local_238 = 8;
          }
        }
      }
      dVar12 = imagestats.noise5;
      dVar11 = imagestats.noise3;
      dVar10 = imagestats.noise2;
      dVar30 = imagestats.noise2;
      if (imagestats.noise2 == 0.0 || imagestats.noise3 <= imagestats.noise2) {
        dVar30 = imagestats.noise3;
      }
      uVar26 = SUB84(imagestats.noise5,0);
      uVar27 = (undefined4)((ulong)imagestats.noise5 >> 0x20);
      if (imagestats.noise5 == 0.0 || dVar30 <= imagestats.noise5) {
        uVar26 = SUB84(dVar30,0);
        uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
      }
      local_230 = uVar22;
      dVar30 = log10((double)CONCAT44(uVar27,uVar26));
      printf("\n File: %s\n",local_1e0);
      puts(
          "  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR"
          );
      printf("  %3d  %s",(ulong)local_230,dtype);
      snprintf(dimen,100," (%ld",naxes[0]);
      sVar15 = strlen(dimen);
      for (lVar16 = 1; lVar16 < naxis; lVar16 = lVar16 + 1) {
        iVar14 = (int)sVar15;
        if (iVar14 < 99) {
          snprintf(dimen + iVar14,(ulong)(100 - iVar14),",%ld",naxes[lVar16]);
        }
        sVar15 = strlen(dimen);
      }
      sVar15 = strlen(dimen);
      if (sVar15 < 99) {
        sVar15 = strlen(dimen);
        (dimen + sVar15)[0] = ')';
        (dimen + sVar15)[1] = '\0';
      }
      printf("%-12s",dimen);
      ffghad(inputfptr,&headstart,&datastart,&dataend,&stat);
      lVar13 = datastart;
      lVar16 = dataend;
      fits_read_image_speed(local_1f8,&whole_elapse,&whole_cpu,&row_elapse,&row_cpu,&stat);
      dVar9 = imagestats.sigma;
      dVar8 = imagestats.mean;
      dVar7 = imagestats.maxval;
      dVar6 = imagestats.minval;
      iVar14 = imagestats.n_nulls;
      local_908 = (double)((float)local_238 / (float)(dVar30 / 0.301 + 1.792));
      printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
             (ulong)(uint)imagestats.n_nulls);
      puts("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1");
      dVar30 = (double)whole_elapse;
      dVar1 = (double)whole_cpu;
      printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n");
      if (in_stack_0000049c != '\0') {
        local_8e0 = (double)row_elapse;
        local_8d8 = (double)row_cpu;
        local_8f8 = dVar12;
        local_900 = iVar14;
        local_908 = (double)naxes[1];
        local_c8 = SUB84(dVar10,0);
        local_8f0 = dVar30;
        local_8e8 = dVar1;
        fprintf((FILE *)outreport,
                " %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g"
                ,SUB84((double)(float)((double)(lVar16 - lVar13) / 1000000.0),0),SUB84(dVar6,0),
                dVar7,dVar8,SUB84(dVar9,0),imagestats.noise1,local_c8,dVar11,local_1e0,
                (ulong)local_230,(ulong)(uint)bitpix,naxes[0]);
      }
      fits_set_lossy_int(outfptr,iStack0000000000000028,&stat);
      plVar18 = local_1c8;
      if (((0 < bitpix) && (iStack0000000000000028 != 0)) &&
         (((double)CONCAT44(uVar27,uVar26) <
           (double)(fStack000000000000002c * fStack000000000000000c) ||
          ((double)CONCAT44(uVar27,uVar26) < (double)in_stack_00000030)))) {
        fits_set_lossy_int(outfptr,0,&stat);
        ffghdn(local_1f8,&hdunum);
        printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
               ,(ulong)(uint)hdunum);
      }
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(outfptr,0xb,&stat);
        fits_set_tile_dim(outfptr,6,plVar18,&stat);
        fits_set_quantize_method
                  (outfptr,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&stat);
        fits_set_quantize_level(outfptr,fStack000000000000000c,&stat);
        fits_set_dither_offset(outfptr,iStack0000000000000014,&stat);
        fits_set_hcomp_scale(outfptr,fStack000000000000001c,&stat);
        fits_set_hcomp_smooth(outfptr,iStack0000000000000024,&stat);
        pfVar4 = outfptr2;
        pfVar3 = outfptr;
        puVar19 = (undefined8 *)&stack0x00000008;
        pdVar21 = &local_908;
        for (lVar16 = 0xd5; lVar16 != 0; lVar16 = lVar16 + -1) {
          *pdVar21 = (double)*puVar19;
          puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
          pdVar21 = pdVar21 + (ulong)bVar25 * -2 + 1;
        }
        fp_test_hdu(local_1f8,pfVar3,pfVar4,&stat);
      }
      pfVar3 = local_1f8;
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(outfptr,0x29,&stat);
        fits_set_tile_dim(outfptr,6,plVar18,&stat);
        fits_set_quantize_method
                  (outfptr,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&stat);
        fits_set_quantize_level(outfptr,fStack000000000000000c,&stat);
        fits_set_dither_offset(outfptr,iStack0000000000000014,&stat);
        fits_set_hcomp_scale(outfptr,fStack000000000000001c,&stat);
        fits_set_hcomp_smooth(outfptr,iStack0000000000000024,&stat);
        pfVar5 = outfptr2;
        pfVar4 = outfptr;
        puVar19 = (undefined8 *)&stack0x00000008;
        pdVar21 = &local_908;
        for (lVar16 = 0xd5; lVar16 != 0; lVar16 = lVar16 + -1) {
          *pdVar21 = (double)*puVar19;
          puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
          pdVar21 = pdVar21 + (ulong)bVar25 * -2 + 1;
        }
        fp_test_hdu(pfVar3,pfVar4,pfVar5,&stat);
      }
      fits_set_compression_type(outfptr,(iStack0000000000000008 == 0x16) + 0x15,&stat);
      fits_set_tile_dim(outfptr,6,plVar18,&stat);
      fits_set_quantize_method
                (outfptr,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&stat);
      fits_set_quantize_level(outfptr,fStack000000000000000c,&stat);
      fits_set_dither_offset(outfptr,iStack0000000000000014,&stat);
      fits_set_hcomp_scale(outfptr,fStack000000000000001c,&stat);
      fits_set_hcomp_smooth(outfptr,iStack0000000000000024,&stat);
      pfVar5 = outfptr2;
      pfVar4 = outfptr;
      puVar19 = (undefined8 *)&stack0x00000008;
      pdVar21 = &local_908;
      for (lVar16 = 0xd5; lVar16 != 0; lVar16 = lVar16 + -1) {
        *pdVar21 = (double)*puVar19;
        puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
        pdVar21 = pdVar21 + (ulong)bVar25 * -2 + 1;
      }
      fp_test_hdu(pfVar3,pfVar4,pfVar5,&stat);
      if (in_stack_0000049c != '\0') {
        fputc(10,(FILE *)outreport);
      }
      uVar22 = local_230;
      if (!bVar2) {
        ffdelt(local_1f8,&stat);
        tempfilename3[0] = '\0';
      }
    }
    else if ((hdutype == 2) && (in_stack_00000088 != 0)) {
      ffgnrwll(inputfptr,&nrows,&stat);
      ffgncl(inputfptr,&ncols,&stat);
      printf("\n File: %s, HDU %d,  %d cols X %lld rows\n",local_1e0,uVar23,(ulong)(uint)ncols);
      pfVar4 = inputfptr;
      pfVar3 = outfptr;
      puVar19 = (undefined8 *)&stack0x00000008;
      pdVar21 = &local_908;
      for (lVar16 = 0xd5; lVar16 != 0; lVar16 = lVar16 + -1) {
        *pdVar21 = (double)*puVar19;
        puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
        pdVar21 = pdVar21 + (ulong)bVar25 * -2 + 1;
      }
      fp_test_table(pfVar4,pfVar3,pfVar3,&stat);
    }
    else {
      ffcopy(inputfptr,outfptr,0,&stat);
      ffcopy(inputfptr,outfptr2,0,&stat);
    }
    ffmrhd(inputfptr,1,(int *)0x0,&stat);
    uVar23 = (ulong)(uVar22 + 1);
    iVar14 = stat;
  } while( true );
}

Assistant:

int fp_test (char *infits, char *outfits, char *outfits2, fpstate fpvar)
{
	fitsfile *inputfptr, *infptr, *outfptr, *outfptr2, *tempfile;

	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix = 0, extnum = 0, len;
	int     tstatus = 0, hdunum, rescale_flag, bpix, ncols;
	char	dtype[8], dimen[100];
	double  bscale, rescale, noisemin;
	long headstart, datastart, dataend;
	float origdata = 0., whole_cpu, whole_elapse, row_elapse, row_cpu, xbits;

	LONGLONG nrows;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	fits_open_file (&inputfptr, infits, READONLY, &stat);
	fits_create_file (&outfptr, outfits, &stat);
	fits_create_file (&outfptr2, outfits2, &stat);

	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	while (! stat) {
	    
	    /*  LOOP OVER EACH HDU */
	    rescale_flag = 0;
	    fits_get_hdu_type (inputfptr, &hdutype, &stat);

	    if (hdutype == IMAGE_HDU) {
	        fits_get_img_param (inputfptr, 9, &bitpix, &naxis, naxes, &stat);
	        for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	    }

	    if (!fits_is_compressed_image (inputfptr,  &stat) && hdutype == IMAGE_HDU &&
		naxis != 0 && totpix != 0 && fpvar.do_images) {

		/* rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(inputfptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);

		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(inputfptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(inputfptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in CWD */
			  
                	  /* create temporary file name */
			  fp_tmpnam("Tmpfile3", "", tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(inputfptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(inputfptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);

			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

			  infptr = tempfile;
			  rescale_flag = 1;
			}
		   }
		 }

		if (!rescale_flag)   /* just compress the input file, without rescaling */
		   infptr = inputfptr;

		/* compute basic statistics about the input image */
                if (bitpix == BYTE_IMG) {
		   bpix = 8;
		   strcpy(dtype, "8  ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == SHORT_IMG) {
		   bpix = 16;
		   strcpy(dtype, "16 ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONG_IMG) {
		   bpix = 32;
		   strcpy(dtype, "32 ");
		   fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONGLONG_IMG) {
		   bpix = 64;
		   strcpy(dtype, "64 ");
		} else if (bitpix == FLOAT_IMG)   {
		   bpix = 32;
		   strcpy(dtype, "-32");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == DOUBLE_IMG)  {
		   bpix = 64;
		   strcpy(dtype, "-64");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		}

		/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
		noisemin = imagestats.noise3;
		if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
		if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

                xbits = (float) (log10(noisemin)/.301 + 1.792);

		printf("\n File: %s\n", infits);
		printf("  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR\n");

		printf("  %3d  %s", extnum, dtype);
		snprintf(dimen,100," (%ld", naxes[0]);
		len =strlen(dimen);
		for (ii = 1; ii < naxis; ii++) {
                    if (len < 99)
		       snprintf(dimen+len,100-len,",%ld", naxes[ii]);
		    len =strlen(dimen);
		}
                if (strlen(dimen)<99)
		   strcat(dimen, ")");
		printf("%-12s",dimen);

		fits_get_hduaddr(inputfptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);

		/* get elapsed and cpu times need to read the uncompressed image */
		fits_read_image_speed (infptr, &whole_elapse, &whole_cpu,
		               &row_elapse, &row_cpu, &stat);

		printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
		        imagestats.n_nulls, imagestats.minval, imagestats.maxval, 
		      imagestats.mean, imagestats.sigma, 
		      imagestats.noise2, imagestats.noise3, imagestats.noise5, xbits, bpix/xbits);

		printf("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1\n");

		printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n",
		        whole_elapse, whole_cpu, row_elapse, row_cpu);

		if (fpvar.outfile[0]) {
		    fprintf(outreport,
	" %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g",
		      infits, extnum, bitpix, naxes[0], naxes[1], origdata, imagestats.n_nulls, imagestats.minval, 
		      imagestats.maxval, imagestats.mean, imagestats.sigma, 
		      imagestats.noise1, imagestats.noise2, imagestats.noise3, imagestats.noise5, whole_elapse, whole_cpu, row_elapse, row_cpu);
		}

		fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (noisemin < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);
			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);
			} 
		}

		/* test compression ratio and speed for each algorithm */

		if (fpvar.quantize_level != 0) {

		  fits_set_compression_type (outfptr, RICE_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.quantize_level != 0) {
\
  		  fits_set_compression_type (outfptr, HCOMPRESS_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.comptype == GZIP_2) {
		    fits_set_compression_type (outfptr, GZIP_2, &stat);
		} else {
		    fits_set_compression_type (outfptr, GZIP_1, &stat);
		}

		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);

/*
		fits_set_compression_type (outfptr, BZIP2_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
		fits_set_compression_type (outfptr, PLIO_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
                if (bitpix == SHORT_IMG || bitpix == LONG_IMG) {
		  fits_set_compression_type (outfptr, NOCOMPRESS, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);	  
		}
*/
		if (fpvar.outfile[0])
		    fprintf(outreport,"\n");

		/* delete the temporary file */
		if (rescale_flag)  { 
		    fits_delete_file (infptr, &stat);
		    tempfilename3[0] = '\0';   /* clear the temp filename */ 
                }
	    } else if ( (hdutype == BINARY_TBL) && fpvar.do_tables) {

    		fits_get_num_rowsll(inputfptr, &nrows, &stat);
    		fits_get_num_cols(inputfptr, &ncols, &stat);
#if defined(_MSC_VER)
                /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
 		printf("\n File: %s, HDU %d,  %d cols X %I64d rows\n", infits, extnum, ncols, nrows);
#elif (USE_LL_SUFFIX == 1)
 		printf("\n File: %s, HDU %d,  %d cols X %lld rows\n", infits, extnum, ncols, nrows);
#else
 		printf("\n File: %s, HDU %d,  %d cols X %ld rows\n", infits, extnum, ncols, nrows);
#endif
		fp_test_table(inputfptr, outfptr, outfptr2, fpvar, &stat);	  

	    } else {
		fits_copy_hdu (inputfptr, outfptr, 0, &stat);
		fits_copy_hdu (inputfptr, outfptr2, 0, &stat);
	    }

	    fits_movrel_hdu (inputfptr, 1, NULL, &stat);
            extnum++;
	}


	if (stat == END_OF_FILE) stat = 0;

	fits_close_file (outfptr2, &stat);
	fits_close_file (outfptr, &stat);
	fits_close_file (inputfptr, &stat);

	if (stat) {
	  fits_report_error (stderr, stat);
	}
	return(0);
}